

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  uint8_t uVar1;
  _Bool _Var2;
  uint uVar3;
  run_container_t *container;
  ulong uVar4;
  uint32_t start_rank;
  uint32_t local_2c;
  
  local_2c = 0;
  if ((bm->high_low_container).size < 1) {
    uVar4 = 0;
    _Var2 = false;
  }
  else {
    uVar4 = 0;
    do {
      container = (run_container_t *)(bm->high_low_container).containers[uVar4];
      uVar1 = (bm->high_low_container).typecodes[uVar4];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&container->runs;
        container = *(run_container_t **)container;
      }
      if (uVar1 == '\x03') {
        _Var2 = run_container_select(container,&local_2c,rank,element);
      }
      else if (uVar1 == '\x02') {
        uVar3 = container->n_runs + local_2c;
        if (rank < uVar3) {
          *element = (uint)(&container->runs->value)[rank - local_2c];
          _Var2 = true;
        }
        else {
          _Var2 = false;
          local_2c = uVar3;
        }
      }
      else {
        _Var2 = bitset_container_select((bitset_container_t *)container,&local_2c,rank,element);
      }
      uVar4 = uVar4 + 1;
      if (_Var2 != false) goto LAB_0010a596;
    } while ((long)uVar4 < (long)(bm->high_low_container).size);
  }
  if (_Var2 != false) {
LAB_0010a596:
    *element = *element | (uint)(bm->high_low_container).keys[(uVar4 & 0xffffffff) - 1] << 0x10;
  }
  return _Var2;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}